

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O0

void __thiscall testing::TestInfo::Run(TestInfo *this)

{
  bool bVar1;
  UnitTestImpl *this_00;
  TestEventListeners *this_01;
  TestEventListener *pTVar2;
  Test *this_02;
  OsStackTraceGetterInterface *pOVar3;
  Test *pTVar4;
  TimeInMillis TVar5;
  TestInfo *in_RDI;
  Test *test;
  TimeInMillis start;
  TestEventListener *repeater;
  UnitTestImpl *impl;
  TestFactoryBase *in_stack_00000058;
  UnitTestImpl *in_stack_ffffffffffffffc0;
  
  if ((in_RDI->should_run_ & 1U) != 0) {
    this_00 = internal::GetUnitTestImpl();
    internal::UnitTestImpl::set_current_test_info(this_00,in_RDI);
    UnitTest::GetInstance();
    this_01 = UnitTest::listeners((UnitTest *)0x138924);
    pTVar2 = TestEventListeners::repeater(this_01);
    (*pTVar2->_vptr_TestEventListener[7])(pTVar2,in_RDI);
    this_02 = (Test *)internal::GetTimeInMillis();
    pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffc0);
    (*pOVar3->_vptr_OsStackTraceGetterInterface[3])();
    pTVar4 = internal::
             HandleExceptionsInMethodIfSupported<testing::internal::TestFactoryBase,testing::Test*>
                       (in_stack_00000058,(offset_in_TestFactoryBase_to_subr)impl,(char *)repeater);
    if ((pTVar4 != (Test *)0x0) && (bVar1 = Test::HasFatalFailure(), !bVar1)) {
      Test::Run(this_02);
    }
    pOVar3 = internal::UnitTestImpl::os_stack_trace_getter(in_stack_ffffffffffffffc0);
    (*pOVar3->_vptr_OsStackTraceGetterInterface[3])();
    internal::HandleExceptionsInMethodIfSupported<testing::Test,void>
              ((Test *)this,(offset_in_Test_to_subr)repeater,(char *)start);
    TVar5 = internal::GetTimeInMillis();
    TestResult::set_elapsed_time(&in_RDI->result_,TVar5 - (long)this_02);
    (*pTVar2->_vptr_TestEventListener[9])(pTVar2,in_RDI);
    internal::UnitTestImpl::set_current_test_info(this_00,(TestInfo *)0x0);
  }
  return;
}

Assistant:

void TestInfo::Run() {
  if (!should_run_) return;

  // Tells UnitTest where to store test result.
  internal::UnitTestImpl* const impl = internal::GetUnitTestImpl();
  impl->set_current_test_info(this);

  TestEventListener* repeater = UnitTest::GetInstance()->listeners().repeater();

  // Notifies the unit test event listeners that a test is about to start.
  repeater->OnTestStart(*this);

  const TimeInMillis start = internal::GetTimeInMillis();

  impl->os_stack_trace_getter()->UponLeavingGTest();

  // Creates the test object.
  Test* const test = internal::HandleExceptionsInMethodIfSupported(
      factory_, &internal::TestFactoryBase::CreateTest,
      "the test fixture's constructor");

  // Runs the test only if the test object was created and its
  // constructor didn't generate a fatal failure.
  if ((test != NULL) && !Test::HasFatalFailure()) {
    // This doesn't throw as all user code that can throw are wrapped into
    // exception handling code.
    test->Run();
  }

  // Deletes the test object.
  impl->os_stack_trace_getter()->UponLeavingGTest();
  internal::HandleExceptionsInMethodIfSupported(
      test, &Test::DeleteSelf_, "the test fixture's destructor");

  result_.set_elapsed_time(internal::GetTimeInMillis() - start);

  // Notifies the unit test event listener that a test has just finished.
  repeater->OnTestEnd(*this);

  // Tells UnitTest to stop associating assertion results to this
  // test.
  impl->set_current_test_info(NULL);
}